

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O3

QLatin1StringView language::lookupEnum<21>(EnumLookup (*array) [21],int value,int defaultIndex)

{
  long lVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = 0;
  do {
    if (*(int *)((long)&(*array)[0].value + lVar1) == value) {
      qVar2 = *(qsizetype *)((long)&(*array)[0].valueString.m_size + lVar1);
      pcVar3 = *(char **)((long)&(*array)[0].valueString.m_data + lVar1);
      goto LAB_0015333d;
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1f8);
  qVar2 = (*array)[defaultIndex].valueString.m_size;
  pcVar3 = (*array)[defaultIndex].valueString.m_data;
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_20 = "default";
  QMessageLogger::warning
            (local_38,"uic: Warning: Invalid enumeration value %d, defaulting to %s",value,pcVar3);
LAB_0015333d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar4.m_data = pcVar3;
    QVar4.m_size = qVar2;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QLatin1StringView lookupEnum(const EnumLookup(&array)[N], int value, int defaultIndex = 0)
{
    for (int i = 0; i < N; ++i) {
        if (value == array[i].value)
            return array[i].valueString;
    }
    auto defaultValue = array[defaultIndex].valueString;
    qWarning("uic: Warning: Invalid enumeration value %d, defaulting to %s",
             value, defaultValue.data());
    return defaultValue;
}